

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_http_server.c
# Opt level: O2

cio_error bs_read_at_least_call_fails
                    (cio_buffered_stream *buffered_stream,cio_read_buffer *buffer,size_t num,
                    cio_buffered_stream_read_handler_t handler,void *handler_context)

{
  return CIO_BAD_FILE_DESCRIPTOR;
}

Assistant:

static enum cio_error bs_read_at_least_call_fails(struct cio_buffered_stream *buffered_stream, struct cio_read_buffer *buffer, size_t num, cio_buffered_stream_read_handler_t handler, void *handler_context)
{
	(void)buffered_stream;
	(void)buffer;
	(void)num;
	(void)handler;
	(void)handler_context;
	return CIO_BAD_FILE_DESCRIPTOR;
}